

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  uint uVar2;
  HuffmanCode *huffmanCode;
  ulong uVar3;
  int n;
  int wei;
  HuffmanTree HT;
  uint local_40;
  int local_3c;
  HuffmanTree local_38;
  
  printf("\nn =");
  __isoc99_scanf("%d",&local_40);
  uVar2 = local_40;
  huffmanCode = (HuffmanCode *)malloc((long)(int)local_40 * 4 + 4);
  printf("\ninput the %d element\'s weight: \n",(ulong)uVar2);
  if (0 < (int)local_40) {
    uVar3 = 1;
    do {
      printf("%d: ",uVar3 & 0xffffffff);
      fflush(_stdin);
      __isoc99_scanf("%d",&local_3c);
      *(int *)((long)huffmanCode + uVar3 * 4) = local_3c;
      bVar1 = (long)uVar3 < (long)(int)local_40;
      uVar3 = uVar3 + 1;
    } while (bVar1);
  }
  createHuffmanTree(&local_38,(int *)huffmanCode,local_40);
  creatHuffmanCode(&local_38,huffmanCode,local_40);
  return 0;
}

Assistant:

int main(void){
    HuffmanTree HT;
    HuffmanCode HC;
    int *w,i,n,wei,m;

    printf("\nn =");

    scanf("%d",&n);

    w = (int *)malloc((n + 1) * sizeof(int));

    printf("\ninput the %d element's weight: \n",n);

    for (int i = 1; i <= n;i++) {
        printf("%d: ",i);
        fflush(stdin);
        scanf("%d",&wei);
        w[i] = wei;
    }
    createHuffmanTree(&HT,w,n);
    creatHuffmanCode(&HT,&HC,n);

    return 0;
}